

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::ResizeBuffer(PF_BufferMgr *this,int iNewSize)

{
  undefined1 auVar1 [16];
  RC RVar2;
  ulong uVar3;
  char *pcVar4;
  int local_4c;
  int local_48;
  int newSlot;
  int next;
  int slot;
  PF_BufPageDesc *pOldBufTable;
  PF_BufPageDesc *pPStack_30;
  int oldFirst;
  PF_BufPageDesc *pNewBufTable;
  int local_20;
  RC rc;
  int i;
  int iNewSize_local;
  PF_BufferMgr *this_local;
  
  rc = iNewSize;
  _i = this;
  ClearBuffer(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)rc;
  uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pPStack_30 = (PF_BufPageDesc *)operator_new__(uVar3);
  local_20 = 0;
  while( true ) {
    if (rc <= local_20) {
      pPStack_30[rc + -1].next = -1;
      pPStack_30->prev = -1;
      newSlot = this->first;
      _next = this->bufTable;
      this->numPages = rc;
      this->last = -1;
      this->first = -1;
      this->free = 0;
      this->bufTable = pPStack_30;
      pOldBufTable._4_4_ = newSlot;
      while (newSlot != -1) {
        local_48 = _next[newSlot].next;
        RVar2 = PF_HashTable::Delete(&this->hashTable,_next[newSlot].fd,_next[newSlot].pageNum);
        if (RVar2 != 0) {
          return RVar2;
        }
        pNewBufTable._4_4_ = 0;
        newSlot = local_48;
      }
      newSlot = pOldBufTable._4_4_;
      while( true ) {
        if (newSlot == -1) {
          if (_next != (PF_BufPageDesc *)0x0) {
            operator_delete__(_next);
          }
          return 0;
        }
        local_48 = _next[newSlot].next;
        pNewBufTable._4_4_ = InternalAlloc(this,&local_4c);
        if (pNewBufTable._4_4_ != 0) break;
        pNewBufTable._4_4_ =
             PF_HashTable::Insert
                       (&this->hashTable,_next[newSlot].fd,_next[newSlot].pageNum,local_4c);
        if ((pNewBufTable._4_4_ != 0) ||
           (pNewBufTable._4_4_ =
                 InitPageDesc(this,_next[newSlot].fd,_next[newSlot].pageNum,local_4c),
           pNewBufTable._4_4_ != 0)) {
          return pNewBufTable._4_4_;
        }
        Unlink(this,local_4c);
        InsertFree(this,local_4c);
        newSlot = local_48;
      }
      return pNewBufTable._4_4_;
    }
    uVar3 = (ulong)this->pageSize;
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pcVar4 = (char *)operator_new__(uVar3);
    pPStack_30[local_20].pData = pcVar4;
    if (pcVar4 == (char *)0x0) break;
    memset(pPStack_30[local_20].pData,0,(long)this->pageSize);
    pPStack_30[local_20].prev = local_20 + -1;
    pPStack_30[local_20].next = local_20 + 1;
    local_20 = local_20 + 1;
  }
  std::operator<<((ostream *)&std::cerr,"Not enough memory for buffer\n");
  exit(1);
}

Assistant:

RC PF_BufferMgr::ResizeBuffer(int iNewSize)
{
   int i;
   RC rc;

   // First try and clear out the old buffer!
   ClearBuffer();

   // Allocate memory for a new buffer table
   PF_BufPageDesc *pNewBufTable = new PF_BufPageDesc[iNewSize];

   // Initialize the new buffer table and allocate memory for buffer
   // pages.  Initially, the free list contains all pages
   for (i = 0; i < iNewSize; i++) {
      if ((pNewBufTable[i].pData = new char[pageSize]) == NULL) {
         cerr << "Not enough memory for buffer\n";
         exit(1);
      }

      memset ((void *)pNewBufTable[i].pData, 0, pageSize);

      pNewBufTable[i].prev = i - 1;
      pNewBufTable[i].next = i + 1;
   }
   pNewBufTable[0].prev = pNewBufTable[iNewSize - 1].next = INVALID_SLOT;

   // Now we must remember the old first and last slots and (of course)
   // the buffer table itself.  Then we use insert methods to insert
   // each of the entries into the new buffertable
   int oldFirst = first;
   PF_BufPageDesc *pOldBufTable = bufTable;

   // Setup the new number of pages,  first, last and free
   numPages = iNewSize;
   first = last = INVALID_SLOT;
   free = 0;

   // Setup the new buffer table
   bufTable = pNewBufTable;

   // We must first remove from the hashtable any possible entries
   int slot, next, newSlot;
   slot = oldFirst;
   while (slot != INVALID_SLOT) {
      next = pOldBufTable[slot].next;

      // Must remove the entry from the hashtable from the
      if ((rc=hashTable.Delete(pOldBufTable[slot].fd, pOldBufTable[slot].pageNum)))
         return (rc);
      slot = next;
   }

   // Now we traverse through the old buffer table and copy any old
   // entries into the new one
   slot = oldFirst;
   while (slot != INVALID_SLOT) {

      next = pOldBufTable[slot].next;
      // Allocate a new slot for the old page
      if ((rc = InternalAlloc(newSlot)))
         return (rc);

      // Insert the page into the hash table,
      // and initialize the page description entry
      if ((rc = hashTable.Insert(pOldBufTable[slot].fd,
            pOldBufTable[slot].pageNum, newSlot)) ||
            (rc = InitPageDesc(pOldBufTable[slot].fd,
            pOldBufTable[slot].pageNum, newSlot)))
         return (rc);

      // Put the slot back on the free list before returning the error
      Unlink(newSlot);
      InsertFree(newSlot);

      slot = next;
   }

   // Finally, delete the old buffer table
   delete [] pOldBufTable;

   return 0;
}